

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QPointer<QObject>>::emplace<QPointer<QObject>>
          (QMovableArrayOps<QPointer<QObject>_> *this,qsizetype i,QPointer<QObject> *args)

{
  undefined1 uVar1;
  qsizetype qVar2;
  long in_RSI;
  QArrayDataPointer<QPointer<QObject>_> *in_RDI;
  long in_FS_OFFSET;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  QPointer<QObject> tmp;
  QPointer<QObject> *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  undefined1 uVar3;
  Inserter *in_stack_ffffffffffffff90;
  GrowthPosition in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa4;
  byte bVar4;
  Inserter local_40;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QPointer<QObject>_>::needsDetach
                    ((QArrayDataPointer<QPointer<QObject>_> *)
                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  if (!(bool)uVar1) {
    if ((in_RSI == in_RDI->size) &&
       (qVar2 = QArrayDataPointer<QPointer<QObject>_>::freeSpaceAtEnd(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QPointer<QObject>_>::end
                ((QArrayDataPointer<QPointer<QObject>_> *)
                 CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      QPointer<QObject>::QPointer
                ((QPointer<QObject> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0040fe8d;
    }
    if ((in_RSI == 0) &&
       (qVar2 = QArrayDataPointer<QPointer<QObject>_>::freeSpaceAtBegin(in_RDI), qVar2 != 0)) {
      QArrayDataPointer<QPointer<QObject>_>::begin
                ((QArrayDataPointer<QPointer<QObject>_> *)0x40fd2a);
      QPointer<QObject>::QPointer
                ((QPointer<QObject> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_0040fe8d;
    }
  }
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QPointer<QObject>::QPointer
            ((QPointer<QObject> *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  uVar3 = in_RDI->size != 0 && in_RSI == 0;
  bVar4 = uVar3;
  QArrayDataPointer<QPointer<QObject>_>::detachAndGrow
            ((QArrayDataPointer<QPointer<QObject>_> *)
             CONCAT17(uVar1,CONCAT16(uVar3,CONCAT24(in_stack_ffffffffffffffa4,(uint)(byte)uVar3))),
             in_stack_ffffffffffffff9c,(qsizetype)in_stack_ffffffffffffff90,
             (QPointer<QObject> **)in_RDI,
             (QArrayDataPointer<QPointer<QObject>_> *)CONCAT17(uVar3,in_stack_ffffffffffffff80));
  if ((bVar4 & 1) == 0) {
    QMovableArrayOps<QPointer<QObject>_>::Inserter::Inserter
              (in_stack_ffffffffffffff90,in_RDI,CONCAT17(uVar3,in_stack_ffffffffffffff80),
               (qsizetype)in_stack_ffffffffffffff78);
    QMovableArrayOps<QPointer<QObject>_>::Inserter::insertOne
              ((Inserter *)CONCAT17(uVar3,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78);
    QMovableArrayOps<QPointer<QObject>_>::Inserter::~Inserter(&local_40);
  }
  else {
    QArrayDataPointer<QPointer<QObject>_>::begin((QArrayDataPointer<QPointer<QObject>_> *)0x40fde9);
    QPointer<QObject>::QPointer
              ((QPointer<QObject> *)CONCAT17(uVar3,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QPointer<QObject>::~QPointer((QPointer<QObject> *)0x40fe8d);
LAB_0040fe8d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }